

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_list.c
# Opt level: O0

void test_add_head(void)

{
  uint local_14;
  int i;
  
  cunit_start_test("test_add_head");
  head.prev = &head;
  head.next = &head;
  add_elements(elements1,true);
  cunit_named_check(head.next == &elements1[5].node,"test_add_head",0x77,"head->next");
  cunit_named_check(head.prev == &elements1[0].node,"test_add_head",0x78,"head->prev");
  cunit_named_check(elements1[5].node.prev == &head,"test_add_head",0x79,"elements1[%d]->prev",5);
  cunit_named_check(elements1[0].node.next == &head,"test_add_head",0x7a,"elements1[0]->next");
  for (local_14 = 0; (int)local_14 < 5; local_14 = local_14 + 1) {
    cunit_named_check(elements1[(int)local_14].node.prev ==
                      (list_entity *)((long)(int)(local_14 + 1) * 0x18 + 0x106098),"test_add_head",
                      0x7d,"elements1[%d]->prev",(ulong)local_14);
  }
  for (local_14 = 1; (int)local_14 < 6; local_14 = local_14 + 1) {
    cunit_named_check(elements1[(int)local_14].node.next ==
                      (list_entity *)((long)(int)(local_14 - 1) * 0x18 + 0x106098),"test_add_head",
                      0x80,"elements1[%d]->next",(ulong)local_14);
  }
  cunit_end_test("test_add_head");
  return;
}

Assistant:

static void test_add_head(void) {
  int i;

  START_TEST();
  list_init_head(&head);
  add_elements(elements1, true);

  CHECK_TRUE(head.next == &elements1[COUNT-1].node, "head->next");
  CHECK_TRUE(head.prev == &elements1[0].node, "head->prev");
  CHECK_TRUE(elements1[COUNT-1].node.prev == &head, "elements1[%d]->prev", COUNT-1);
  CHECK_TRUE(elements1[0].node.next == &head, "elements1[0]->next");

  for (i=0; i<COUNT-1; i++) {
    CHECK_TRUE(elements1[i].node.prev == &elements1[i+1].node, "elements1[%d]->prev", i);
  }
  for (i=1; i<COUNT; i++) {
    CHECK_TRUE(elements1[i].node.next == &elements1[i-1].node, "elements1[%d]->next", i);
  }
  END_TEST();
}